

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t process_head_file(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  int64_t *piVar1;
  long *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint64_t how_many;
  size_t sVar6;
  size_t sVar7;
  byte bVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  uint8_t *puVar11;
  uint64_t *puVar12;
  byte bVar13;
  char *pcVar14;
  uint64_t *puVar15;
  size_t sVar16;
  uint uVar17;
  int iVar18;
  undefined1 *puVar19;
  size_t how_many_00;
  size_t local_4118;
  uint64_t value_size;
  size_t name_size_1;
  uint64_t *local_4100;
  uint64_t id;
  size_t file_flags;
  size_t value_len;
  size_t sStack_40e0;
  size_t local_40d8;
  uint32_t crc;
  uint32_t mtime;
  size_t file_attr;
  size_t name_size;
  size_t local_40b8;
  uint8_t *local_40b0;
  uint64_t *local_40a8;
  size_t host_os;
  size_t compression_info;
  size_t data_size;
  size_t extra_field_id;
  char *local_4080;
  uint8_t *local_4078;
  uint32_t *local_4070;
  uint64_t *local_4068;
  uint64_t *local_4060;
  uint64_t *local_4058;
  uint8_t *p;
  uint64_t unpacked_size;
  size_t extra_field_size;
  size_t edata_size;
  size_t sStack_4030;
  size_t local_4028;
  char name_utf8_buf [8192];
  
  data_size = 0;
  file_flags = 0;
  file_attr = 0;
  compression_info = 0;
  host_os = 0;
  name_size = 0;
  mtime = 0;
  crc = 0;
  archive_entry_clear(entry);
  if ((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x4) ==
      (undefined1  [19312])0x0) {
    memset(&rar->file,0,0x768);
    blake2sp_init(&(rar->file).b2state,0x20);
    if (((ulong)rar->main & 1) == 0) {
      (rar->cstate).solid_offset = 0;
    }
    else {
      piVar1 = &(rar->cstate).solid_offset;
      *piVar1 = *piVar1 + (rar->cstate).write_ptr;
    }
    (rar->cstate).write_ptr = 0;
    (rar->cstate).last_write_ptr = 0;
    (rar->cstate).last_unstore_ptr = 0;
    (rar->file).redir_type = 0;
    (rar->file).redir_flags = 0;
    free_filters(rar);
  }
  if ((block_flags & 1) == 0) {
    how_many_00 = 0;
  }
  else {
    edata_size = 0;
    wVar9 = read_var_sized(a,&edata_size,(size_t *)0x0);
    how_many_00 = edata_size;
    if (wVar9 == L'\0') {
      return L'\x01';
    }
  }
  if ((block_flags & 2) == 0) {
    (rar->file).bytes_remaining = 0;
    pcVar14 = "no data found in file/service block";
  }
  else {
    wVar9 = read_var_sized(a,&data_size,(size_t *)0x0);
    if (wVar9 == L'\0') {
      return L'\x01';
    }
    (rar->file).bytes_remaining = data_size;
    wVar9 = read_var_sized(a,&file_flags,(size_t *)0x0);
    if (wVar9 == L'\0') {
      return L'\x01';
    }
    wVar9 = read_var(a,&unpacked_size,(uint64_t *)0x0);
    if (wVar9 == L'\0') {
      return L'\x01';
    }
    if ((file_flags & 8) != 0) {
      pcVar14 = "Files with unknown unpacked size are not supported";
LAB_0014fbc4:
      iVar18 = 0x16;
      goto LAB_0014f909;
    }
    (rar->file).field_0x20 = (rar->file).field_0x20 & 0xf7 | ((byte)file_flags & 1) << 3;
    wVar9 = read_var_sized(a,&file_attr,(size_t *)0x0);
    if (wVar9 == L'\0') {
      return L'\x01';
    }
    if (((file_flags & 2) != 0) && (wVar9 = read_u32(a,&mtime), wVar9 == L'\0')) {
      return L'\x01';
    }
    if (((file_flags & 4) != 0) && (wVar9 = read_u32(a,&crc), wVar9 == L'\0')) {
      return L'\x01';
    }
    wVar9 = read_var_sized(a,&compression_info,(size_t *)0x0);
    if (wVar9 == L'\0') {
      return L'\x01';
    }
    bVar8 = (rar->file).field_0x20;
    puVar12 = (uint64_t *)0x0;
    if ((bVar8 & 8) == 0) {
      puVar12 = (uint64_t *)(0x20000L << ((byte)(compression_info >> 10) & 0xf));
    }
    (rar->cstate).method = (uint)(compression_info >> 7) & 7;
    (rar->cstate).version = ((uint)compression_info & 0x3f) + L'2';
    bVar13 = (byte)compression_info >> 6 & 1;
    bVar8 = bVar8 & 0xfe | bVar13;
    (rar->file).field_0x20 = bVar8;
    if (bVar13 == 0) {
      if (puVar12 < (uint64_t *)0x4000001) {
LAB_0014fa6c:
        if (((rar->cstate).window_size < (long)puVar12) &&
           (puVar11 = (rar->cstate).window_buf, puVar11 != (uint8_t *)0x0)) {
          local_4100 = puVar12;
          puVar11 = (uint8_t *)realloc(puVar11,(size_t)puVar12);
          if (puVar11 == (uint8_t *)0x0) {
            pcVar14 = "Not enough memory when trying to realloc the window buffer.";
            goto LAB_0014fbc4;
          }
          (rar->cstate).window_buf = puVar11;
          bVar8 = (rar->file).field_0x20;
          puVar12 = local_4100;
        }
        (rar->cstate).window_size = (ssize_t)puVar12;
        if (((bVar8 & 1) != 0) && ((rar->file).solid_window_size == 0)) {
          (rar->file).solid_window_size = (ssize_t)puVar12;
        }
        puVar19 = (undefined1 *)((long)puVar12 - 1);
        if (puVar12 == (uint64_t *)0x0) {
          puVar19 = (undefined1 *)0x0;
        }
        (rar->cstate).window_mask = (size_t)puVar19;
        (rar->file).field_0x20 = bVar8 & 0xfd;
        wVar9 = read_var_sized(a,&host_os,(size_t *)0x0);
        if (wVar9 == L'\0') {
          return L'\x01';
        }
        if (host_os == 1) {
          archive_entry_set_mode(entry,(mode_t)file_attr);
        }
        else {
          if (host_os != 0) {
            archive_set_error(&a->archive,0x54,"Unsupported Host OS: 0x%x");
            return L'\xffffffe2';
          }
          uVar17 = 0x416d;
          if ((file_attr & 0x10) == 0) {
            uVar17 = 0x8124;
          }
          archive_entry_set_mode(entry,uVar17 | (uint)((file_attr & 1) == 0) << 7);
          local_4100 = (uint64_t *)file_attr;
          if (((file_attr & 7) != 0) &&
             (puVar12 = (uint64_t *)malloc(0x16), puVar12 != (uint64_t *)0x0)) {
            puVar15 = puVar12;
            if (((ulong)local_4100 & 1) != 0) {
              *puVar12 = 0x2c796c6e6f6472;
              puVar15 = (uint64_t *)((long)puVar12 + 7);
            }
            if (((ulong)local_4100 & 2) != 0) {
              *puVar15 = 0x2c6e6564646968;
              puVar15 = (uint64_t *)((long)puVar15 + 7);
            }
            if (((ulong)local_4100 & 4) != 0) {
              *puVar15 = 0x2c6d6574737973;
              puVar15 = (uint64_t *)((long)puVar15 + 7);
            }
            if (puVar12 < puVar15) {
              *(undefined1 *)((long)puVar15 + -1) = 0;
              local_4100 = puVar12;
              archive_entry_copy_fflags_text(entry,(char *)puVar12);
              puVar12 = local_4100;
            }
            free(puVar12);
          }
        }
        wVar9 = read_var_sized(a,&name_size,(size_t *)0x0);
        if (wVar9 == L'\0') {
          return L'\x01';
        }
        wVar9 = read_ahead(a,name_size,&p);
        sVar6 = name_size;
        if (wVar9 == L'\0') {
          return L'\x01';
        }
        if (name_size < 0x800) {
          if (name_size != 0) {
            memcpy(name_utf8_buf,p,name_size);
            name_utf8_buf[sVar6] = '\0';
            wVar9 = consume(a,sVar6);
            if (wVar9 != L'\0') {
              return L'\x01';
            }
            archive_entry_update_pathname_utf8(entry,name_utf8_buf);
            if (0 < (long)how_many_00) {
              extra_field_id = 0;
              local_4100 = &(rar->file).redir_type;
              local_40a8 = &(rar->file).redir_flags;
              local_4058 = &(rar->file).e_mtime;
              local_4060 = &(rar->file).e_ctime;
              local_4068 = &(rar->file).e_atime;
              local_4070 = &(rar->file).e_unix_ns;
              local_4078 = (rar->file).blake2sp;
              wVar9 = L'\xffffffe2';
LAB_0014fd6e:
              if ((long)how_many_00 < 1) goto LAB_00150590;
              wVar9 = read_var_sized(a,&extra_field_size,&local_40b8);
              sVar6 = local_40b8;
              if ((((wVar9 == L'\0') || (wVar9 = consume(a,local_40b8), wVar9 != L'\0')) ||
                  (wVar9 = read_var_sized(a,&extra_field_id,&local_40b8), sVar7 = local_40b8,
                  wVar9 == L'\0')) || (wVar9 = consume(a,local_40b8), wVar9 != L'\0')) {
                return L'\x01';
              }
              how_many_00 = how_many_00 - (sVar6 + sVar7);
              switch(extra_field_id) {
              case 2:
                edata_size = 0;
                wVar9 = read_var_sized(a,&edata_size,&value_len);
                if (wVar9 == L'\0') break;
                how_many_00 = how_many_00 - value_len;
                local_4118 = how_many_00;
                wVar9 = consume(a,value_len);
                if (wVar9 == L'\0') {
                  if (edata_size != 0) {
                    archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%x)");
LAB_0014fe83:
                    wVar9 = L'\xffffffe2';
                    goto LAB_0014fd6e;
                  }
                  wVar9 = read_ahead(a,0x20,(uint8_t **)&value_size);
                  if (wVar9 != L'\0') {
                    (rar->file).has_blake2 = '\x01';
                    uVar3 = *(undefined8 *)value_size;
                    uVar4 = *(undefined8 *)(value_size + 8);
                    uVar5 = *(undefined8 *)(value_size + 0x18);
                    *(undefined8 *)(local_4078 + 0x10) = *(undefined8 *)(value_size + 0x10);
                    *(undefined8 *)(local_4078 + 0x18) = uVar5;
                    *(undefined8 *)local_4078 = uVar3;
                    *(undefined8 *)(local_4078 + 8) = uVar4;
                    wVar9 = consume(a,0x20);
                    if (wVar9 == L'\0') {
                      how_many_00 = how_many_00 - 0x20;
                      goto LAB_0015038e;
                    }
                  }
                }
                break;
              case 3:
                edata_size = 0;
                wVar9 = read_var_sized(a,&edata_size,&value_len);
                if (wVar9 != L'\0') {
                  how_many_00 = how_many_00 - value_len;
                  local_4118 = how_many_00;
                  wVar10 = consume(a,value_len);
                  puVar12 = local_4058;
                  wVar9 = L'\x01';
                  if (wVar10 != L'\0') goto LAB_0014fd6e;
                  bVar8 = (byte)edata_size & 1;
                  if ((edata_size & 2) != 0) {
                    parse_htime_item(a,bVar8,local_4058,(ssize_t *)&local_4118);
                    archive_entry_set_mtime(entry,*puVar12,0);
                  }
                  puVar12 = local_4060;
                  if ((edata_size & 4) != 0) {
                    parse_htime_item(a,bVar8,local_4060,(ssize_t *)&local_4118);
                    archive_entry_set_ctime(entry,*puVar12,0);
                  }
                  puVar12 = local_4068;
                  if ((edata_size & 8) != 0) {
                    parse_htime_item(a,bVar8,local_4068,(ssize_t *)&local_4118);
                    archive_entry_set_atime(entry,*puVar12,0);
                  }
                  if ((edata_size & 0x10) == 0) {
                    wVar9 = L'\0';
                    how_many_00 = local_4118;
                    goto LAB_0014fd6e;
                  }
                  wVar9 = read_u32(a,local_4070);
                  how_many_00 = local_4118;
                  if (wVar9 != L'\0') {
                    how_many_00 = local_4118 - 4;
LAB_0015038e:
                    wVar9 = L'\0';
                    local_4118 = how_many_00;
                    goto LAB_0014fd6e;
                  }
                }
                break;
              case 4:
                value_size = 0;
                id = 0;
                name_size_1 = 0;
                wVar9 = read_var_sized(a,&value_size,&name_size_1);
                if (wVar9 != L'\0') {
                  how_many_00 = how_many_00 - name_size_1;
                  wVar9 = consume(a,name_size_1);
                  if ((wVar9 == L'\0') &&
                     (wVar9 = read_var_sized(a,&id,&name_size_1), wVar9 != L'\0')) {
                    how_many_00 = how_many_00 - name_size_1;
                    local_4118 = how_many_00;
                    wVar9 = consume(a,name_size_1);
                    if (wVar9 == L'\0') {
                      local_4080 = archive_entry_pathname_utf8(entry);
                      if (local_4080 == (char *)0x0) {
                        iVar18 = 0x16;
                        pcVar14 = "Version entry without file name";
                        goto LAB_0015049f;
                      }
                      edata_size = 0;
                      sStack_4030 = 0;
                      local_4028 = 0;
                      value_len = 0;
                      sStack_40e0 = 0;
                      local_40d8 = 0;
                      wVar9 = L'\0';
                      archive_string_sprintf((archive_string *)&edata_size,";%zu",id);
                      archive_strcat((archive_string *)&value_len,local_4080);
                      archive_strcat((archive_string *)&value_len,(void *)edata_size);
                      archive_entry_update_pathname_utf8(entry,(char *)value_len);
                      archive_string_free((archive_string *)&edata_size);
                      archive_string_free((archive_string *)&value_len);
                      goto LAB_0014fd6e;
                    }
                  }
                }
                break;
              case 5:
                value_len = 0;
                value_size = 0;
                wVar9 = read_var(a,local_4100,&value_len);
                if ((wVar9 != L'\0') && (wVar9 = consume(a,value_len), wVar9 == L'\0')) {
                  how_many_00 = how_many_00 - value_len;
                  local_4118 = how_many_00;
                  wVar9 = read_var(a,local_40a8,&value_len);
                  if ((wVar9 != L'\0') && (wVar9 = consume(a,value_len), wVar9 == L'\0')) {
                    how_many_00 = how_many_00 - value_len;
                    local_4118 = how_many_00;
                    wVar9 = read_var_sized(a,&value_size,(size_t *)0x0);
                    if (wVar9 != L'\0') {
                      how_many_00 = how_many_00 + ~value_size;
                      local_4118 = how_many_00;
                      wVar9 = read_ahead(a,value_size,(uint8_t **)&id);
                      how_many = value_size;
                      if (wVar9 != L'\0') {
                        if (value_size < 0x800) {
                          if (value_size != 0) {
                            memcpy(&edata_size,(void *)id,value_size);
                            *(undefined1 *)((long)&edata_size + how_many) = 0;
                            wVar9 = consume(a,how_many);
                            if (wVar9 != L'\0') break;
                            wVar9 = L'\0';
                            if (*local_4100 - 1 < 2) {
                              archive_entry_set_filetype(entry,0xa000);
                              archive_entry_update_symlink_utf8(entry,(char *)&edata_size);
                              if ((*local_40a8 & 1) == 0) {
                                wVar9 = L'\x01';
                              }
                              else {
                                wVar9 = L'\x02';
                              }
                              archive_entry_set_symlink_type(entry,wVar9);
                              wVar9 = L'\0';
                            }
                            else if (*local_4100 == 4) {
                              archive_entry_set_filetype(entry,0x8000);
                              archive_entry_update_hardlink_utf8(entry,(char *)&edata_size);
                            }
                            goto LAB_0014fd6e;
                          }
                          iVar18 = 0x54;
                          pcVar14 = "No link target specified";
                        }
                        else {
                          iVar18 = 0x54;
                          pcVar14 = "Link target is too long";
                        }
LAB_0015049f:
                        archive_set_error(&a->archive,iVar18,pcVar14);
                        goto LAB_0014fe83;
                      }
                    }
                  }
                }
                break;
              case 6:
                value_len = 0;
                value_size = 0;
                id = 0;
                name_size_1 = 0;
                wVar9 = read_var(a,&value_len,&value_size);
                if ((wVar9 == L'\0') || (wVar9 = consume(a,value_size), wVar9 != L'\0')) break;
                how_many_00 = how_many_00 - value_size;
                local_4118 = how_many_00;
                if ((value_len & 1) != 0) {
                  wVar9 = read_var_sized(a,&name_size_1,(size_t *)0x0);
                  if (wVar9 != L'\0') {
                    how_many_00 = how_many_00 + ~name_size_1;
                    local_4118 = how_many_00;
                    wVar9 = read_ahead(a,name_size_1,&local_40b0);
                    sVar6 = name_size_1;
                    if (wVar9 != L'\0') {
                      sVar16 = 0xff;
                      if (name_size_1 < 0xff) {
                        sVar16 = name_size_1;
                      }
                      memcpy(&edata_size,local_40b0,sVar16);
                      *(undefined1 *)((long)&edata_size + sVar16) = 0;
                      wVar9 = consume(a,sVar6);
                      if (wVar9 == L'\0') {
                        archive_entry_set_uname(entry,(char *)&edata_size);
                        goto LAB_0014feed;
                      }
                    }
                  }
                  break;
                }
LAB_0014feed:
                if ((value_len & 2) != 0) {
                  wVar9 = read_var_sized(a,&name_size_1,(size_t *)0x0);
                  if (wVar9 != L'\0') {
                    how_many_00 = how_many_00 + ~name_size_1;
                    local_4118 = how_many_00;
                    wVar9 = read_ahead(a,name_size_1,&local_40b0);
                    sVar6 = name_size_1;
                    if (wVar9 != L'\0') {
                      sVar16 = 0xff;
                      if (name_size_1 < 0xff) {
                        sVar16 = name_size_1;
                      }
                      memcpy(&edata_size,local_40b0,sVar16);
                      *(undefined1 *)((long)&edata_size + sVar16) = 0;
                      wVar9 = consume(a,sVar6);
                      if (wVar9 == L'\0') {
                        archive_entry_set_gname(entry,(char *)&edata_size);
                        goto LAB_0014fef5;
                      }
                    }
                  }
                  break;
                }
LAB_0014fef5:
                if ((value_len & 4) != 0) {
                  wVar9 = read_var(a,&id,&value_size);
                  if ((wVar9 == L'\0') || (wVar9 = consume(a,value_size), wVar9 != L'\0')) break;
                  how_many_00 = how_many_00 - value_size;
                  local_4118 = how_many_00;
                  archive_entry_set_uid(entry,id);
                }
                wVar9 = L'\0';
                if ((value_len & 8) == 0) goto LAB_0014fd6e;
                wVar10 = read_var(a,&id,&value_size);
                if ((wVar10 != L'\0') && (wVar10 = consume(a,value_size), wVar10 == L'\0')) {
                  how_many_00 = how_many_00 - value_size;
                  local_4118 = how_many_00;
                  archive_entry_set_gid(entry,id);
                  goto LAB_0014fd6e;
                }
                break;
              default:
                wVar9 = consume(a,how_many_00);
                goto LAB_00150590;
              }
              wVar9 = L'\x01';
              goto LAB_0014fd6e;
            }
LAB_00150599:
            if (((file_flags & 8) == 0) &&
               ((rar->file).unpacked_size = unpacked_size, (rar->file).redir_type == 0)) {
              archive_entry_set_size(entry,unpacked_size);
            }
            if ((file_flags & 2) != 0) {
              archive_entry_set_mtime(entry,(ulong)mtime,0);
            }
            if ((file_flags & 4) != 0) {
              (rar->file).stored_crc32 = crc;
            }
            if ((*(byte *)&rar->cstate & 4) == 0) {
              *(byte *)&rar->cstate = *(byte *)&rar->cstate & 0xf0 | 10;
            }
            if ((undefined1  [12])((undefined1  [12])rar->generic & (undefined1  [12])0x2) !=
                (undefined1  [12])0x0) {
              return L'\xfffffff6';
            }
            return L'\0';
          }
          pcVar14 = "No filename specified";
        }
        else {
          pcVar14 = "Filename is too long";
        }
      }
      else {
LAB_0014fbdb:
        pcVar14 = "Declared dictionary size is not supported.";
      }
    }
    else if ((rar->cstate).window_buf == (uint8_t *)0x0) {
      pcVar14 = "Declared solid file, but no window buffer initialized yet.";
    }
    else {
      if ((uint64_t *)0x4000000 < puVar12) goto LAB_0014fbdb;
      plVar2 = (long *)(rar->file).solid_window_size;
      if (((long)plVar2 < 1) || ((uint64_t *)plVar2 == puVar12)) goto LAB_0014fa6c;
      pcVar14 = 
      "Window size for this solid file doesn\'t match the window size used in previous solid file. "
      ;
    }
  }
  iVar18 = 0x54;
LAB_0014f909:
  archive_set_error(&a->archive,iVar18,pcVar14);
  return L'\xffffffe2';
LAB_00150590:
  if (wVar9 != L'\0') {
    return wVar9;
  }
  goto LAB_00150599;
}

Assistant:

static int process_head_file(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	ssize_t extra_data_size = 0;
	size_t data_size = 0;
	size_t file_flags = 0;
	size_t file_attr = 0;
	size_t compression_info = 0;
	size_t host_os = 0;
	size_t name_size = 0;
	uint64_t unpacked_size, window_size;
	uint32_t mtime = 0, crc = 0;
	int c_method = 0, c_version = 0;
	char name_utf8_buf[MAX_NAME_IN_BYTES];
	const uint8_t* p;

	enum FILE_FLAGS {
		DIRECTORY = 0x0001, UTIME = 0x0002, CRC32 = 0x0004,
		UNKNOWN_UNPACKED_SIZE = 0x0008,
	};

	enum FILE_ATTRS {
		ATTR_READONLY = 0x1, ATTR_HIDDEN = 0x2, ATTR_SYSTEM = 0x4,
		ATTR_DIRECTORY = 0x10,
	};

	enum COMP_INFO_FLAGS {
		SOLID = 0x0040,
	};

	enum HOST_OS {
		HOST_WINDOWS = 0,
		HOST_UNIX = 1,
	};

	archive_entry_clear(entry);

	/* Do not reset file context if we're switching archives. */
	if(!rar->cstate.switch_multivolume) {
		reset_file_context(rar);
	}

	if(block_flags & HFL_EXTRA_DATA) {
		size_t edata_size = 0;
		if(!read_var_sized(a, &edata_size, NULL))
			return ARCHIVE_EOF;

		/* Intentional type cast from unsigned to signed. */
		extra_data_size = (ssize_t) edata_size;
	}

	if(block_flags & HFL_DATA) {
		if(!read_var_sized(a, &data_size, NULL))
			return ARCHIVE_EOF;

		rar->file.bytes_remaining = data_size;
	} else {
		rar->file.bytes_remaining = 0;

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"no data found in file/service block");
		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &file_flags, NULL))
		return ARCHIVE_EOF;

	if(!read_var(a, &unpacked_size, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UNKNOWN_UNPACKED_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Files with unknown unpacked size are not supported");
		return ARCHIVE_FATAL;
	}

	rar->file.dir = (uint8_t) ((file_flags & DIRECTORY) > 0);

	if(!read_var_sized(a, &file_attr, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UTIME) {
		if(!read_u32(a, &mtime))
			return ARCHIVE_EOF;
	}

	if(file_flags & CRC32) {
		if(!read_u32(a, &crc))
			return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &compression_info, NULL))
		return ARCHIVE_EOF;

	c_method = (int) (compression_info >> 7) & 0x7;
	c_version = (int) (compression_info & 0x3f);

	/* RAR5 seems to limit the dictionary size to 64MB. */
	window_size = (rar->file.dir > 0) ?
		0 :
		g_unpack_window_size << ((compression_info >> 10) & 15);
	rar->cstate.method = c_method;
	rar->cstate.version = c_version + 50;
	rar->file.solid = (compression_info & SOLID) > 0;

	/* Archives which declare solid files without initializing the window
	 * buffer first are invalid. */

	if(rar->file.solid > 0 && rar->cstate.window_buf == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Declared solid file, but no window buffer "
				  "initialized yet.");
		return ARCHIVE_FATAL;
	}

	/* Check if window_size is a sane value. Also, if the file is not
	 * declared as a directory, disallow window_size == 0. */
	if(window_size > (64 * 1024 * 1024) ||
	    (rar->file.dir == 0 && window_size == 0))
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Declared dictionary size is not supported.");
		return ARCHIVE_FATAL;
	}

	if(rar->file.solid > 0) {
		/* Re-check if current window size is the same as previous
		 * window size (for solid files only). */
		if(rar->file.solid_window_size > 0 &&
		    rar->file.solid_window_size != (ssize_t) window_size)
		{
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Window size for this solid file doesn't match "
			    "the window size used in previous solid file. ");
			return ARCHIVE_FATAL;
		}
	}

	if(rar->cstate.window_size < (ssize_t) window_size &&
	    rar->cstate.window_buf)
	{
		/* If window_buf has been allocated before, reallocate it, so
		 * that its size will match new window_size. */

		uint8_t* new_window_buf =
			realloc(rar->cstate.window_buf, window_size);

		if(!new_window_buf) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"Not enough memory when trying to realloc the window "
				"buffer.");
			return ARCHIVE_FATAL;
		}

		rar->cstate.window_buf = new_window_buf;
	}

	/* Values up to 64M should fit into ssize_t on every
	 * architecture. */
	rar->cstate.window_size = (ssize_t) window_size;

	if(rar->file.solid > 0 && rar->file.solid_window_size == 0) {
		/* Solid files have to have the same window_size across
		   whole archive. Remember the window_size parameter
		   for first solid file found. */
		rar->file.solid_window_size = rar->cstate.window_size;
	}

	init_window_mask(rar);

	rar->file.service = 0;

	if(!read_var_sized(a, &host_os, NULL))
		return ARCHIVE_EOF;

	if(host_os == HOST_WINDOWS) {
		/* Host OS is Windows */

		__LA_MODE_T mode;

		if(file_attr & ATTR_DIRECTORY) {
			if (file_attr & ATTR_READONLY) {
				mode = 0555 | AE_IFDIR;
			} else {
				mode = 0755 | AE_IFDIR;
			}
		} else {
			if (file_attr & ATTR_READONLY) {
				mode = 0444 | AE_IFREG;
			} else {
				mode = 0644 | AE_IFREG;
			}
		}

		archive_entry_set_mode(entry, mode);

		if (file_attr & (ATTR_READONLY | ATTR_HIDDEN | ATTR_SYSTEM)) {
			char *fflags_text, *ptr;
			/* allocate for "rdonly,hidden,system," */
			fflags_text = malloc(22 * sizeof(char));
			if (fflags_text != NULL) {
				ptr = fflags_text;
				if (file_attr & ATTR_READONLY) {
					strcpy(ptr, "rdonly,");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_HIDDEN) {
					strcpy(ptr, "hidden,");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_SYSTEM) {
					strcpy(ptr, "system,");
					ptr = ptr + 7;
				}
				if (ptr > fflags_text) {
					/* Delete trailing comma */
					*(ptr - 1) = '\0';
					archive_entry_copy_fflags_text(entry,
					    fflags_text);
				}
				free(fflags_text);
			}
		}
	} else if(host_os == HOST_UNIX) {
		/* Host OS is Unix */
		archive_entry_set_mode(entry, (__LA_MODE_T) file_attr);
	} else {
		/* Unknown host OS */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Unsupported Host OS: 0x%x", (int) host_os);

		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &name_size, NULL))
		return ARCHIVE_EOF;

	if(!read_ahead(a, name_size, &p))
		return ARCHIVE_EOF;

	if(name_size > (MAX_NAME_IN_CHARS - 1)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Filename is too long");

		return ARCHIVE_FATAL;
	}

	if(name_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"No filename specified");

		return ARCHIVE_FATAL;
	}

	memcpy(name_utf8_buf, p, name_size);
	name_utf8_buf[name_size] = 0;
	if(ARCHIVE_OK != consume(a, name_size)) {
		return ARCHIVE_EOF;
	}

	archive_entry_update_pathname_utf8(entry, name_utf8_buf);

	if(extra_data_size > 0) {
		int ret = process_head_file_extra(a, entry, rar,
		    extra_data_size);

		/*
		 * TODO: rewrite or remove useless sanity check
		 *       as extra_data_size is not passed as a pointer
		 *
		if(extra_data_size < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			    "File extra data size is not zero");
			return ARCHIVE_FATAL;
		}
		 */

		if(ret != ARCHIVE_OK)
			return ret;
	}

	if((file_flags & UNKNOWN_UNPACKED_SIZE) == 0) {
		rar->file.unpacked_size = (ssize_t) unpacked_size;
		if(rar->file.redir_type == REDIR_TYPE_NONE)
			archive_entry_set_size(entry, unpacked_size);
	}

	if(file_flags & UTIME) {
		archive_entry_set_mtime(entry, (time_t) mtime, 0);
	}

	if(file_flags & CRC32) {
		rar->file.stored_crc32 = crc;
	}

	if(!rar->cstate.switch_multivolume) {
		/* Do not reinitialize unpacking state if we're switching
		 * archives. */
		rar->cstate.block_parsing_finished = 1;
		rar->cstate.all_filters_applied = 1;
		rar->cstate.initialized = 0;
	}

	if(rar->generic.split_before > 0) {
		/* If now we're standing on a header that has a 'split before'
		 * mark, it means we're standing on a 'continuation' file
		 * header. Signal the caller that if it wants to move to
		 * another file, it must call rar5_read_header() function
		 * again. */

		return ARCHIVE_RETRY;
	} else {
		return ARCHIVE_OK;
	}
}